

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_282016::PeerManagerImpl::UnitTestMisbehaving
          (PeerManagerImpl *this,NodeId peer_id)

{
  string_view file;
  string *message;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  CValidationInterface in_stack_ffffffffffffffb8;
  NetEventsInterface in_stack_ffffffffffffffc0;
  atomic<ServiceFlags> *paVar1;
  atomic<ServiceFlags> local_28 [2];
  undefined8 local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetPeerRef((PeerManagerImpl *)&stack0xffffffffffffffb8,(NodeId)this);
  if ((PeerManagerImpl *)in_stack_ffffffffffffffb8._vptr_CValidationInterface ==
      (PeerManagerImpl *)0x0) {
    file._M_str = (char *)0x13;
    file._M_len = (size_t)in_stack_ffffffffffffffc0._vptr_NetEventsInterface;
    assertion_fail(file,0,(string_view)ZEXT816(0x7e80bb),in_stack_00000000);
  }
  paVar1 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffffc8,"");
  Misbehaving((PeerManagerImpl *)in_stack_ffffffffffffffb8._vptr_CValidationInterface,
              (Peer *)&stack0xffffffffffffffc8,message);
  if (paVar1 != local_28) {
    operator_delete(paVar1,local_28[0]._M_i + NODE_NETWORK);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      in_stack_ffffffffffffffc0._vptr_NetEventsInterface !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               in_stack_ffffffffffffffc0._vptr_NetEventsInterface);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_peer_mutex) { Misbehaving(*Assert(GetPeerRef(peer_id)), ""); }